

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O1

void __thiscall libDAI::IJGP::IJGP(IJGP *this,FactorGraph *fg,Properties *opts)

{
  pointer pvVar1;
  pointer pVVar2;
  iterator iVar3;
  undefined1 *puVar4;
  pointer pBVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  VarSet *cl;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_type sVar10;
  undefined4 extraout_var_04;
  _Base_ptr p_Var11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer pdVar12;
  undefined4 extraout_var_07;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *__x;
  size_t sVar13;
  undefined4 extraout_var_08;
  ostream *poVar14;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  Var *pVVar15;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  pointer pBVar16;
  undefined4 extraout_var_17;
  mapped_type_conflict *pmVar17;
  long lVar18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  Exception *this_00;
  pointer pTVar19;
  long lVar20;
  _Base_ptr p_Var21;
  pointer __n;
  Bucket *pBVar22;
  IJGP *pIVar23;
  size_t e;
  pointer pBVar24;
  pointer this_01;
  pointer pVVar25;
  size_t alpha;
  pointer pdVar26;
  size_t I;
  ulong uVar27;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> ElimOrder;
  VarSet Ivars;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> minibuckets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ElimSeq;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> mb_i;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> buckets;
  Var vi;
  ClusterGraph _cg;
  FRegion local_368;
  Bucket *local_320;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_318;
  undefined1 local_300 [16];
  pointer local_2f0;
  _Base_ptr local_2e8;
  _Base_ptr local_2e0;
  pointer local_2d0;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> local_2c8;
  vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *local_2b0;
  vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *local_2a8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  pointer local_280;
  VarSet local_278;
  vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> local_258;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_228;
  _Base_ptr local_210;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_208;
  _Base_ptr local_1f0;
  Var local_1e8;
  undefined1 local_1d8 [8];
  pointer pFStack_1d0;
  undefined1 auStack_1c8 [16];
  pointer pRStack_1b8;
  pointer pRStack_1b0;
  pointer pVStack_1a8;
  pointer pTStack_1a0;
  pointer local_198;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_190;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  vStack_178;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  avStack_160 [4];
  pointer local_f8;
  pointer pFStack_f0;
  pointer pFStack_e8;
  pointer pRStack_e0;
  pointer pTStack_d8;
  pointer pTStack_d0;
  pointer pTStack_c8;
  pointer pTStack_c0;
  pointer local_b8;
  pointer pTStack_b0;
  pointer pTStack_a8;
  pointer pTStack_a0;
  pointer pTStack_98;
  pointer pvStack_90;
  pointer pvStack_88;
  pointer pvStack_80;
  pointer local_78;
  pointer pvStack_70;
  _Rb_tree_impl<std::less<unsigned_long>,_true> _Stack_68;
  undefined4 extraout_var_18;
  
  pFStack_1d0 = (pointer)((ulong)pFStack_1d0 & 0xffffffff00000000);
  local_1d8 = (undefined1  [8])&PTR__RegionGraph_005e8030;
  FactorGraph::FactorGraph((FactorGraph *)auStack_1c8,fg);
  _Stack_68.super__Rb_tree_header._M_header._M_left = &_Stack_68.super__Rb_tree_header._M_header;
  local_78 = (pointer)0x0;
  pvStack_70 = (pointer)0x0;
  _Stack_68._0_8_ = 0;
  _Stack_68.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_68.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_68.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8 = (pointer)0x0;
  pTStack_b0 = (pointer)0x0;
  pTStack_a8 = (pointer)0x0;
  pTStack_a0 = (pointer)0x0;
  pTStack_98 = (pointer)0x0;
  pvStack_90 = (pointer)0x0;
  pvStack_88 = (pointer)0x0;
  pvStack_80 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  pFStack_f0 = (pointer)0x0;
  pFStack_e8 = (pointer)0x0;
  pRStack_e0 = (pointer)0x0;
  pTStack_d8 = (pointer)0x0;
  pTStack_d0 = (pointer)0x0;
  pTStack_c8 = (pointer)0x0;
  pTStack_c0 = (pointer)0x0;
  _Stack_68.super__Rb_tree_header._M_node_count = 0;
  _Stack_68.super__Rb_tree_header._M_header._M_right =
       _Stack_68.super__Rb_tree_header._M_header._M_left;
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,(RegionGraph *)local_1d8,opts);
  RegionGraph::~RegionGraph((RegionGraph *)local_1d8);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e8110;
  local_2a0 = &this->_Qa;
  local_2a8 = (vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&this->_Qb;
  local_2b0 = (vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&this->_mes
  ;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  (this->Props).i = 0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = initProps(this);
  if (!bVar6) {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    local_1d8 = (undefined1  [8])auStack_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"ijgp.cpp, line 68","");
    Exception::Exception(this_00,8,(string *)local_1d8);
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  avStack_160[0].
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_160[0].
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = (pointer)0x0;
  local_190.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_178.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_178.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_178.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  avStack_160[0].
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8 = (undefined1  [8])0x0;
  pFStack_1d0 = (pointer)0x0;
  auStack_1c8._0_8_ = (pointer)0x0;
  auStack_1c8._8_8_ = (pointer)0x0;
  pRStack_1b8 = (pointer)0x0;
  pRStack_1b0 = (pointer)0x0;
  pVStack_1a8 = (pointer)0x0;
  pTStack_1a0 = (pointer)0x0;
  uVar27 = 0;
  while( true ) {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x48))
                      ((long *)CONCAT44(extraout_var,iVar7));
    if (uVar9 <= uVar27) break;
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    cl = (VarSet *)
         (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x50))
                   ((long *)CONCAT44(extraout_var_00,iVar7),uVar27);
    ClusterGraph::insert((ClusterGraph *)local_1d8,cl);
    uVar27 = uVar27 + 1;
  }
  ClusterGraph::eraseNonMaximal((ClusterGraph *)local_1d8);
  ClusterGraph::MinFill(&local_318,(ClusterGraph *)local_1d8);
  local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_298,
             (long)local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  if (local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar20 = 0;
    uVar27 = 0;
    do {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
      local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x40))
                              ((long *)CONCAT44(extraout_var_01,iVar7),
                               (long)&(local_318.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_label + lVar20);
      if (local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_298,
                   (iterator)
                   local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_368);
      }
      else {
        *local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_long)
             local_368.super_Factor._vs._vars.
             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar27 = uVar27 + 1;
      lVar20 = lVar20 + 0x10;
    } while (uVar27 < (ulong)((long)local_318.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_318.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (2 < CONCAT44(extraout_var_02,iVar7)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"MinFill variable elimination order:",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    if (local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar20 = 0;
      uVar27 = 0;
      do {
        if (uVar27 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        libDAI::operator<<((ostream *)&std::cout,
                           (Var *)((long)&(local_318.
                                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_label +
                                  lVar20));
        uVar27 = uVar27 + 1;
        lVar20 = lVar20 + 0x10;
      } while (uVar27 < (ulong)((long)local_318.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_318.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  local_258.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  sVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x28))
                     ((long *)CONCAT44(extraout_var_03,iVar7));
  std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::reserve
            (&local_258,sVar10);
  p_Var21 = (_Base_ptr)0x0;
  while( true ) {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    p_Var11 = (_Base_ptr)
              (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x28))
                        ((long *)CONCAT44(extraout_var_04,iVar7));
    if (p_Var11 <= p_Var21) break;
    local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.super_Factor._vs._statespace = (size_t)p_Var21;
    std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::
    emplace_back<libDAI::IJGP::Bucket>(&local_258,(Bucket *)&local_368);
    std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::~vector
              ((vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_> *)
               &local_368);
    p_Var21 = (_Base_ptr)((long)&p_Var21->_M_color + 1);
  }
  local_2c8.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  sVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x28))
                     ((long *)CONCAT44(extraout_var_05,iVar7));
  std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::reserve
            (&local_2c8,sVar10);
  pdVar26 = (pointer)0x0;
  while( true ) {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    pdVar12 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x48))
                                 ((long *)CONCAT44(extraout_var_06,iVar7));
    if (pdVar12 <= pdVar26) break;
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    __x = (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
          (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x50))
                    ((long *)CONCAT44(extraout_var_07,iVar7),pdVar26);
    pIVar23 = (IJGP *)local_300;
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)pIVar23,__x);
    local_2e8 = (_Base_ptr)
                __x[1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start;
    sVar13 = findElimOrderIndex(pIVar23,&local_318,(VarSet *)local_300,0);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
    pVVar15 = (Var *)local_300._0_8_;
    if (2 < CONCAT44(extraout_var_08,iVar7)) {
      for (; pVVar15 != (Var *)local_300._8_8_; pVVar15 = pVVar15 + 1) {
        libDAI::operator<<((ostream *)&std::cout,pVVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"->",2);
      poVar14 = libDAI::operator<<((ostream *)&std::cout,
                                   local_318.
                                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                   _M_impl.super__Vector_impl_data._M_start + sVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
    pBVar24 = local_258.
              super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
              _M_impl.super__Vector_impl_data._M_start +
              ((long *)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start)[sVar13];
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
              (&local_208,(vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)local_300);
    local_1f0 = local_2e8;
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368,&local_208);
    local_368.super_Factor._vs._statespace = (size_t)local_1f0;
    local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_368.super_Factor._p._p.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,1);
    local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar26;
    std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
    emplace_back<libDAI::IJGP::BucketEntry>
              (&pBVar24->
                super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>,
               (BucketEntry *)&local_368);
    if (local_368.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super_Factor._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_208.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((Var *)local_300._0_8_ != (Var *)0x0) {
      operator_delete((void *)local_300._0_8_,(long)local_2f0 - local_300._0_8_);
    }
    pdVar26 = (pointer)((long)pdVar26 + 1);
  }
  if (local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = (pointer)0x0;
  }
  else {
    pTVar19 = (pointer)0x0;
    __n = (pointer)0x0;
    do {
      local_1e8._label =
           local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start[(long)pTVar19]._label;
      local_1e8._states =
           local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start[(long)pTVar19]._states;
      local_280 = pTVar19;
      partitionBucket((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)
                      &local_278,this,
                      local_258.
                      super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      ((long *)local_298.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start)[(long)pTVar19],
                      (this->Props).i);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_09,iVar7)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"number of minibuckets created: ",0x1f);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      __n = (pointer)((long)__n +
                     ((long)local_278._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_278._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5) + -1);
      if (local_278._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_278._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_240 = (pointer)((long)&(local_280->_vs)._vars.
                                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 1);
        pBVar22 = (Bucket *)0x0;
        do {
          local_320 = pBVar22;
          std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::push_back
                    (&local_2c8,
                     (value_type *)
                     ((VarSet *)
                      &(local_278._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start)->_label + (long)pBVar22));
          Bucket::vars((VarSet *)local_300,
                       local_2c8.
                       super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
          if (2 < CONCAT44(extraout_var_10,iVar7)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  mb.vars = ",0xc);
            for (pVVar15 = (Var *)local_300._0_8_; pVVar15 != (Var *)local_300._8_8_;
                pVVar15 = pVVar15 + 1) {
              libDAI::operator<<((ostream *)&std::cout,pVVar15);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
          }
          pIVar23 = (IJGP *)local_300;
          VarSet::operator/=((VarSet *)local_300,&local_1e8);
          if (local_300._8_8_ != local_300._0_8_) {
            sVar13 = findElimOrderIndex(pIVar23,&local_318,(VarSet *)local_300,(size_t)local_240);
            pvVar1 = (pointer)((long *)local_298.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start)[sVar13];
            this_01 = local_258.
                      super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)pvVar1;
            std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                      (&local_228,(vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)local_300);
            pBVar5 = local_2c8.
                     super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pBVar24 = local_2c8.
                      super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_210 = local_2e8;
            local_238 = pvVar1;
            local_230 = __n;
            std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                      ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368,&local_228);
            local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)(((long)pBVar5 - (long)pBVar24 >> 5) - 1);
            local_368.super_Factor._vs._statespace = (size_t)local_210;
            local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_368.super_Factor._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start & 0xffffffffffffff00);
            std::vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>::
            emplace_back<libDAI::IJGP::BucketEntry>
                      (&this_01->
                        super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                       ,(BucketEntry *)&local_368);
            if (local_368.super_Factor._vs._vars.
                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_368.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_368.super_Factor._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_368.super_Factor._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_228.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_228.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_228.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])()
            ;
            __n = (pointer)((long)&(local_230->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
            if (2 < CONCAT44(extraout_var_11,iVar7)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  added arc to bucket",0x15);
              iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                                ();
              pVVar15 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar7) + 0x30))
                                         ((long *)CONCAT44(extraout_var_12,iVar7),local_238);
              poVar14 = libDAI::operator<<((ostream *)&std::cout,pVVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,", i.e. (",8);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              std::ostream::flush();
            }
          }
          if ((Var *)local_300._0_8_ != (Var *)0x0) {
            operator_delete((void *)local_300._0_8_,(long)local_2f0 - local_300._0_8_);
          }
          pBVar22 = (Bucket *)
                    ((long)&(local_320->
                            super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                            ).
                            super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
        } while (pBVar22 < (Bucket *)
                           ((long)local_278._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_278._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector
                ((vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_> *)&local_278);
      pTVar19 = (pointer)((long)&(local_280->_vs)._vars.
                                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
    } while (pTVar19 < (pointer)((long)local_318.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_318.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
             (CONCAT44(extraout_var_13,iVar7) + 0xe0),
             (long)local_2c8.
                   super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_2c8.
                   super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
            ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
             (CONCAT44(extraout_var_14,iVar7) + 0xf8),(size_type)__n);
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)(CONCAT44(extraout_var_15,iVar7) + 0x110),(long)__n * 2);
  if (local_2c8.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_2c8.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pVVar25 = (pointer)0x0;
    do {
      pBVar24 = local_2c8.
                super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
      local_320 = pBVar24 + (long)pVVar25;
      Bucket::vars(&local_278,local_320);
      TFactor<double>::TFactor((TFactor<double> *)local_300,&local_278,1.0);
      TFactor<double>::TFactor(&local_368.super_Factor,(TFactor<double> *)local_300);
      local_368._c = 1.0;
      std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::emplace_back<libDAI::FRegion>
                ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
                 (CONCAT44(extraout_var_16,iVar7) + 0xe0),&local_368);
      if (local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_368.super_Factor._p._p.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_368.super_Factor._p._p.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_368.super_Factor._p._p.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_368.super_Factor._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_368.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_368.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2e0 != (_Base_ptr)0x0) {
        operator_delete(local_2e0,(long)local_2d0 - (long)local_2e0);
      }
      if ((Var *)local_300._0_8_ != (Var *)0x0) {
        operator_delete((void *)local_300._0_8_,(long)local_2f0 - local_300._0_8_);
      }
      if ((pointer)local_278._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_278._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_278._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pBVar16 = (local_320->
                super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>)
                .
                super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((local_320->
          super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>).
          super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish != pBVar16) {
        lVar20 = 0x28;
        uVar27 = 0;
        do {
          if (*(char *)((long)pBVar16 + lVar20 + -8) == '\x01') {
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])()
            ;
            local_368.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start =
                 *(pointer *)
                  ((long)&(((local_320->
                            super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                            ).
                            super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_VarSet)._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar20);
            pmVar17 = std::
                      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    *)(CONCAT44(extraout_var_17,iVar7) + 0x170),
                                   (key_type *)&local_368);
            *pmVar17 = (mapped_type_conflict)pVVar25;
          }
          else {
            pVVar2 = *(pointer *)
                      ((long)&(pBVar16->super_VarSet)._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar20);
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            lVar18 = CONCAT44(extraout_var_18,iVar7);
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            local_368.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((*(long *)(CONCAT44(extraout_var_19,iVar7) + 0x100) -
                            *(long *)(CONCAT44(extraout_var_19,iVar7) + 0xf8) >> 3) *
                          -0x3333333333333333);
            iVar3._M_current = *(pair<unsigned_long,_unsigned_long> **)(lVar18 + 0x118);
            if (iVar3._M_current == *(pair<unsigned_long,_unsigned_long> **)(lVar18 + 0x120)) {
              local_368.super_Factor._vs._vars.
              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start = pVVar25;
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)(lVar18 + 0x110),iVar3,(pair<unsigned_long,_unsigned_long> *)&local_368)
              ;
            }
            else {
              (iVar3._M_current)->first = (unsigned_long)pVVar25;
              (iVar3._M_current)->second =
                   (unsigned_long)
                   local_368.super_Factor._vs._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              *(long *)(lVar18 + 0x118) = *(long *)(lVar18 + 0x118) + 0x10;
              local_368.super_Factor._vs._vars.
              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start = pVVar25;
            }
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            lVar18 = CONCAT44(extraout_var_20,iVar7);
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            local_368.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((*(long *)(CONCAT44(extraout_var_21,iVar7) + 0x100) -
                            *(long *)(CONCAT44(extraout_var_21,iVar7) + 0xf8) >> 3) *
                          -0x3333333333333333);
            iVar3._M_current = *(pair<unsigned_long,_unsigned_long> **)(lVar18 + 0x118);
            local_368.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start = pVVar2;
            if (iVar3._M_current == *(pair<unsigned_long,_unsigned_long> **)(lVar18 + 0x120)) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)(lVar18 + 0x110),iVar3,(pair<unsigned_long,_unsigned_long> *)&local_368)
              ;
            }
            else {
              (iVar3._M_current)->first = (unsigned_long)pVVar2;
              (iVar3._M_current)->second =
                   (unsigned_long)
                   local_368.super_Factor._vs._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              *(long *)(lVar18 + 0x118) = *(long *)(lVar18 + 0x118) + 0x10;
            }
            iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            lVar18 = *(long *)(CONCAT44(extraout_var_23,iVar8) + 0xe0);
            iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])()
            ;
            VarSet::operator&((VarSet *)local_300,(VarSet *)(lVar18 + (long)pVVar25 * 0x40),
                              (VarSet *)
                              ((long)pVVar2 * 0x40 +
                              *(long *)(CONCAT44(extraout_var_24,iVar8) + 0xe0)));
            std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                      ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368,
                       (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)local_300);
            local_368.super_Factor._vs._statespace = (size_t)local_2e8;
            local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
            std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::
            emplace_back<libDAI::Region>
                      ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                       (CONCAT44(extraout_var_22,iVar7) + 0xf8),(Region *)&local_368);
            if (local_368.super_Factor._vs._vars.
                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_368.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_368.super_Factor._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_368.super_Factor._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((Var *)local_300._0_8_ != (Var *)0x0) {
              operator_delete((void *)local_300._0_8_,(long)local_2f0 - local_300._0_8_);
            }
          }
          uVar27 = uVar27 + 1;
          pBVar16 = (local_320->
                    super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                    ).
                    super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = lVar20 + 0x30;
        } while (uVar27 < (ulong)(((long)(local_320->
                                         super_vector<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                         ).
                                         super__Vector_base<libDAI::IJGP::BucketEntry,_std::allocator<libDAI::IJGP::BucketEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar16
                                  >> 4) * -0x5555555555555555));
      }
      if ((pVVar25 != (pointer)0x0) &&
         (puVar4 = (undefined1 *)((long)&pVVar25[-1]._states + 7),
         local_2c8.super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>.
         _M_impl.super__Vector_impl_data._M_start[(long)puVar4].var == local_320->var)) {
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        lVar20 = CONCAT44(extraout_var_25,iVar7);
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_368.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((*(long *)(CONCAT44(extraout_var_26,iVar7) + 0x100) -
                        *(long *)(CONCAT44(extraout_var_26,iVar7) + 0xf8) >> 3) *
                      -0x3333333333333333);
        iVar3._M_current = *(pair<unsigned_long,_unsigned_long> **)(lVar20 + 0x118);
        if (iVar3._M_current == *(pair<unsigned_long,_unsigned_long> **)(lVar20 + 0x120)) {
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = pVVar25;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)(lVar20 + 0x110),iVar3,(pair<unsigned_long,_unsigned_long> *)&local_368);
        }
        else {
          (iVar3._M_current)->first = (unsigned_long)pVVar25;
          (iVar3._M_current)->second =
               (unsigned_long)
               local_368.super_Factor._vs._vars.
               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(long *)(lVar20 + 0x118) = *(long *)(lVar20 + 0x118) + 0x10;
          local_368.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = pVVar25;
        }
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        lVar20 = CONCAT44(extraout_var_27,iVar7);
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_368.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((*(long *)(CONCAT44(extraout_var_28,iVar7) + 0x100) -
                        *(long *)(CONCAT44(extraout_var_28,iVar7) + 0xf8) >> 3) *
                      -0x3333333333333333);
        iVar3._M_current = *(pair<unsigned_long,_unsigned_long> **)(lVar20 + 0x118);
        local_368.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar4;
        if (iVar3._M_current == *(pair<unsigned_long,_unsigned_long> **)(lVar20 + 0x120)) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)(lVar20 + 0x110),iVar3,(pair<unsigned_long,_unsigned_long> *)&local_368);
        }
        else {
          (iVar3._M_current)->first = (unsigned_long)puVar4;
          (iVar3._M_current)->second =
               (unsigned_long)
               local_368.super_Factor._vs._vars.
               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(long *)(lVar20 + 0x118) = *(long *)(lVar20 + 0x118) + 0x10;
        }
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        pVVar15 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar8) + 0x30))
                                   ((long *)CONCAT44(extraout_var_30,iVar8),local_320->var);
        VarSet::VarSet((VarSet *)local_300,pVVar15);
        std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                  ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_368,
                   (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)local_300);
        local_368.super_Factor._vs._statespace = (size_t)local_2e8;
        local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
        std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::emplace_back<libDAI::Region>
                  ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                   (CONCAT44(extraout_var_29,iVar7) + 0xf8),(Region *)&local_368);
        if (local_368.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_368.super_Factor._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_368.super_Factor._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_368.super_Factor._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((Var *)local_300._0_8_ != (Var *)0x0) {
          operator_delete((void *)local_300._0_8_,(long)local_2f0 - local_300._0_8_);
        }
      }
      pVVar25 = (pointer)((long)&pVVar25->_label + 1);
    } while (pVVar25 < (undefined1 *)
                       ((long)local_2c8.
                              super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2c8.
                              super__Vector_base<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate
            ((BipartiteGraph<libDAI::FRegion,_libDAI::Region> *)
             (CONCAT44(extraout_var_31,iVar7) + 0xe0));
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  RegionGraph::RecomputeORs((RegionGraph *)CONCAT44(extraout_var_32,iVar7));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            (local_2a0,
             (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (local_2a0,
             *(long *)(CONCAT44(extraout_var_33,iVar7) + 0xe8) -
             *(long *)(CONCAT44(extraout_var_33,iVar7) + 0xe0) >> 6);
  lVar20 = 0;
  for (uVar27 = 0;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(),
      uVar27 < (ulong)(*(long *)(CONCAT44(extraout_var_34,iVar7) + 0xe8) -
                       *(long *)(CONCAT44(extraout_var_34,iVar7) + 0xe0) >> 6); uVar27 = uVar27 + 1)
  {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (local_2a0,(value_type *)(*(long *)(CONCAT44(extraout_var_35,iVar7) + 0xe0) + lVar20))
    ;
    lVar20 = lVar20 + 0x40;
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)local_2a8
             ,(this->_Qb).
              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start);
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)local_2a8
             ,(*(long *)(CONCAT44(extraout_var_36,iVar7) + 0x100) -
               *(long *)(CONCAT44(extraout_var_36,iVar7) + 0xf8) >> 3) * -0x3333333333333333);
  lVar20 = 0;
  for (uVar27 = 0;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(),
      uVar27 < (ulong)((*(long *)(CONCAT44(extraout_var_37,iVar7) + 0x100) -
                        *(long *)(CONCAT44(extraout_var_37,iVar7) + 0xf8) >> 3) *
                      -0x3333333333333333); uVar27 = uVar27 + 1) {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    TFactor<double>::TFactor
              (&local_368.super_Factor,
               (VarSet *)(*(long *)(CONCAT44(extraout_var_38,iVar7) + 0xf8) + lVar20),1.0);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>(local_2a8,&local_368.super_Factor);
    if (local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super_Factor._p._p.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.super_Factor._p._p.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.super_Factor._p._p.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_368.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super_Factor._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar20 = lVar20 + 0x28;
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)local_2b0
             ,(this->_mes).
              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start);
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)local_2b0
             ,*(long *)(CONCAT44(extraout_var_39,iVar7) + 0x118) -
              *(long *)(CONCAT44(extraout_var_39,iVar7) + 0x110) >> 4);
  lVar20 = 8;
  for (uVar27 = 0;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(),
      uVar27 < (ulong)(*(long *)(CONCAT44(extraout_var_40,iVar7) + 0x118) -
                       *(long *)(CONCAT44(extraout_var_40,iVar7) + 0x110) >> 4); uVar27 = uVar27 + 1
      ) {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    TFactor<double>::TFactor
              (&local_368.super_Factor,
               (VarSet *)
               (*(long *)(*(long *)(CONCAT44(extraout_var_42,iVar8) + 0x110) + lVar20) * 0x28 +
               *(long *)(CONCAT44(extraout_var_41,iVar7) + 0xf8)),1.0);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>(local_2b0,&local_368.super_Factor);
    if (local_368.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super_Factor._p._p.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.super_Factor._p._p.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.super_Factor._p._p.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_368.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super_Factor._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar20 = lVar20 + 0x10;
  }
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  RegionGraph::Check_Counting_Numbers((RegionGraph *)CONCAT44(extraout_var_43,iVar7));
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (2 < CONCAT44(extraout_var_44,iVar7)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Resulting regiongraph: ",0x17);
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    poVar14 = libDAI::operator<<((ostream *)&std::cout,
                                 (RegionGraph *)CONCAT44(extraout_var_45,iVar7));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector(&local_2c8);
  std::vector<libDAI::IJGP::Bucket,_std::allocator<libDAI::IJGP::Bucket>_>::~vector(&local_258);
  if ((pointer)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(avStack_160);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&vStack_178);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_190);
  if (pVStack_1a8 != (pointer)0x0) {
    operator_delete(pVStack_1a8,(long)local_198 - (long)pVStack_1a8);
  }
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
            ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)(auStack_1c8 + 8));
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,auStack_1c8._0_8_ - (long)local_1d8);
  }
  return;
}

Assistant:

IJGP::IJGP( const FactorGraph &fg, const Properties &opts ) : DAIAlgRG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _Qa(), _Qb(), _mes() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        ClusterGraph _cg;

        // Copy factor varsets
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            _cg.insert( grm().factor(I).vars() );
        // Retain only maximal clusters
        _cg.eraseNonMaximal();
        // Obtain (heuristically) optimal elimination sequence
        vector<Var> ElimOrder = _cg.MinFill();
        vector<size_t> ElimSeq;
        ElimSeq.reserve( ElimOrder.size() );
        for( size_t i = 0; i < ElimOrder.size(); i++ )
            ElimSeq.push_back( grm().findVar(ElimOrder[i]) );
        if( Verbose() >= 3 ) {
            cout << "MinFill variable elimination order:" << endl;
            for( size_t i = 0; i < ElimOrder.size(); i++ ) {
                if( i != 0 )
                    cout << ", ";
                cout << ElimOrder[i];
            }
            cout << endl;
        }

        // Each variable has an associated bucket
        vector<Bucket> buckets;
        buckets.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            buckets.push_back( Bucket(i) );

        // Each minibucket will correspond to an outer region
        vector<Bucket> minibuckets;
        minibuckets.reserve( grm().nrVars() );

        // Place each factor in the bucket of the lowest (first-to-eliminate) index variable in its domain
        for( size_t I = 0; I < grm().nrFactors(); I++ ) {
            VarSet Ivars = grm().factor(I).vars();
            size_t lowest = findElimOrderIndex( ElimOrder, Ivars );
            if( Verbose() >= 3 )
                cout << Ivars << "->" << ElimOrder[lowest] << " " << endl;

            buckets[ElimSeq[lowest]].push_back( BucketEntry( Ivars, true, I ) );
        }

        // For each bucket
        size_t nrArcs = 0;
        for( size_t _i = 0; _i < ElimOrder.size(); _i++ ) {
            Var vi = ElimOrder[_i];
            size_t i = ElimSeq[_i];

            // Partition bucket into mini-buckets
            vector<Bucket> mb_i = partitionBucket( buckets[i], Props.i );
            if( Verbose() >= 3 )
                cout << "number of minibuckets created: " << mb_i.size() << endl;
            nrArcs += mb_i.size() - 1;
            for( size_t mb_i_index = 0; mb_i_index < mb_i.size(); mb_i_index++ ) {
                minibuckets.push_back( mb_i[mb_i_index] );

                // Eliminate this variable
                VarSet vars = minibuckets.back().vars();
                if( Verbose() >= 3 )
                    cout << "  mb.vars = " << vars << endl;
                vars /= vi;
                if( vars.size() ) {
                    // Find lowest index variable in vars
                    size_t _j = findElimOrderIndex( ElimOrder, vars, _i+1 );
                    // j is the index of that variable
                    size_t j = ElimSeq[_j];
                    // Insert message into the corresponding bucket of j
                    buckets[j].push_back( BucketEntry(vars, false, minibuckets.size()-1 ) );
                    nrArcs++;
                    if( Verbose() >= 3 )
                        cout << "  added arc to bucket" << grm().var(j) << ", i.e. (" << _i << "," << _j << ")" << endl;
                }
            }
        }

        // Each minibucket becomes an outer region that contains the factors in that minibucket
        // For each message in the minibucket, we add an inner region (corresponding to an
        // arc of the join graph) and two edges
        // We also connect minibuckets of the same var with an inner region
        grm().ORs().reserve( minibuckets.size() );
        grm().IRs().reserve( nrArcs );
        grm().Redges().reserve( 2 * nrArcs );
        for( size_t alpha = 0; alpha < minibuckets.size(); alpha++ ) {
            Bucket & mb = minibuckets[alpha];
            grm().ORs().push_back( FRegion( Factor(mb.vars(), 1.0), 1.0 ) );
            for( size_t bE = 0; bE < mb.size(); bE++ )
                if( mb[bE].isFactor )
                    grm().setFac2OR( mb[bE].pointsTo, alpha );
                else {
                    size_t alpha2 = mb[bE].pointsTo;
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha, grm().IRs().size() ) );
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha2, grm().IRs().size() ) );
                    grm().IRs().push_back( Region( grm().OR(alpha).vars() & grm().OR(alpha2).vars(), -1.0 ) );
                }
            if( alpha )
                if( minibuckets[alpha-1].var == mb.var ) {
                    size_t alpha2 = alpha - 1;
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha, grm().IRs().size() ) );
                    grm().Redges().push_back( RegionGraph::R_edge_t( alpha2, grm().IRs().size() ) );
                    grm().IRs().push_back( Region( grm().var(mb.var), -1.0 ) );
                }
        }
        grm().Regenerate();
        grm().RecomputeORs();

        // Create messages and beliefs
        _Qa.clear();
        _Qa.reserve( grm().nr_ORs() );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( grm().OR(alpha) );

        _Qb.clear();
        _Qb.reserve( grm().nr_IRs() );
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb.push_back( Factor( grm().IR(beta), 1.0 ) );

        _mes.clear();
        _mes.reserve( grm().nr_Redges() );
        for( size_t e = 0; e < grm().nr_Redges(); e++ )
            _mes.push_back( Factor( grm().IR(grm().Redge(e).second), 1.0 ) );

        // Check counting numbers
        grm().Check_Counting_Numbers();

        if( Verbose() >= 3 )
            cout << "Resulting regiongraph: " << grm() << endl;
    }